

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O2

_Bool oonf_layer2_data_set
                (oonf_layer2_data *l2data,oonf_layer2_origin *origin,oonf_layer2_metadata *meta,
                oonf_layer2_value *input)

{
  oonf_layer2_origin *poVar1;
  undefined8 uVar2;
  int iVar3;
  oonf_layer2_metadata *poVar4;
  _Bool _Var5;
  
  poVar4 = l2data->_meta;
  if (meta == (oonf_layer2_metadata *)0x0) {
    meta = poVar4;
    if (poVar4 != (oonf_layer2_metadata *)0x0) goto LAB_0010e3f7;
    if (((&log_global_mask)[_oonf_layer2_subsystem.logging] & 8) != 0) {
      oonf_log(8,(ulong)_oonf_layer2_subsystem.logging,"src/base/oonf_layer2.c",0x15b,0,0,
               "Tried to set layer2 data without metadata (origin: %s)",origin->name);
      abort();
    }
    meta = (oonf_layer2_metadata *)0x0;
  }
  else {
    if (poVar4 == (oonf_layer2_metadata *)0x0) {
      poVar4 = (oonf_layer2_metadata *)0x0;
    }
    else {
LAB_0010e3f7:
      poVar1 = l2data->_origin;
      if ((poVar1 != origin && poVar1 != (oonf_layer2_origin *)0x0) &&
         (origin->priority <= poVar1->priority)) {
        return false;
      }
    }
    _Var5 = true;
    if (poVar4 != meta) goto LAB_0010e44b;
  }
  iVar3 = bcmp(l2data,input,0x18);
  _Var5 = iVar3 != 0;
LAB_0010e44b:
  *(undefined8 *)((long)&l2data->_value + 0x10) = *(undefined8 *)&(input->addr)._type;
  uVar2 = *(undefined8 *)((input->addr)._addr + 8);
  (l2data->_value).integer = input->integer;
  *(undefined8 *)((long)&l2data->_value + 8) = uVar2;
  l2data->_meta = meta;
  l2data->_origin = origin;
  return _Var5;
}

Assistant:

bool
oonf_layer2_data_set(struct oonf_layer2_data *l2data, const struct oonf_layer2_origin *origin,
  const struct oonf_layer2_metadata *meta, const union oonf_layer2_value *input) {
  bool changed = false;

  if (meta == NULL) {
    OONF_ASSERT(l2data->_meta != NULL, LOG_LAYER2, "Tried to set layer2 data without metadata (origin: %s)", origin->name);
    meta = l2data->_meta;
  }
  if (l2data->_meta == NULL || l2data->_origin == NULL || l2data->_origin == origin ||
      l2data->_origin->priority < origin->priority) {
    changed = l2data->_meta != meta || memcmp(&l2data->_value, input, sizeof(*input)) != 0;
    memcpy(&l2data->_value, input, sizeof(*input));
    l2data->_meta = meta;
    l2data->_origin = origin;
  }
  return changed;
}